

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di_errors.cpp
# Opt level: O2

void anon_unknown.dwarf_2af66::compail_fail
               (int id,string *defines,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *errors,string *code)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  istream *piVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line_1;
  pointer pbVar7;
  string *psVar8;
  regex *this;
  char *msg;
  size_type __n;
  pointer pbVar9;
  reference rVar10;
  _Bit_iterator _Var11;
  undefined8 uStack_620;
  regex include_rgx;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> include;
  string local_5a8;
  string local_588 [32];
  vector<bool,_std::allocator<bool>_> matches;
  file<std::basic_ifstream<char,_std::char_traits<char>_>_> output;
  stringstream command;
  ostream local_1a8 [376];
  
  this = &include_rgx;
  uStack_620 = 0x10aaeb;
  std::__cxx11::stringstream::stringstream((stringstream *)&command);
  uStack_620 = 0x10ab01;
  std::__cxx11::string::string((string *)&include,"error",(allocator *)&local_5a8);
  uStack_620 = 0x10ab0d;
  std::__cxx11::to_string((string *)&out,id);
  uStack_620 = 0x10ab1f;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&include_rgx,
                 &include,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out)
  ;
  uStack_620 = 0x10ab36;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&matches,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&include_rgx,
                 ".cpp");
  uStack_620 = 0x10ab4b;
  file<std::basic_ofstream<char,_std::char_traits<char>_>_>::file
            ((file<std::basic_ofstream<char,_std::char_traits<char>_>_> *)&output,(string *)&matches
            );
  uStack_620 = 0x10ab58;
  std::__cxx11::string::~string((string *)&matches);
  uStack_620 = 0x10ab60;
  std::__cxx11::string::~string((string *)&include_rgx);
  uStack_620 = 0x10ab6a;
  std::__cxx11::string::~string((string *)&out);
  uStack_620 = 0x10ab74;
  std::__cxx11::string::~string((string *)&include);
  uStack_620 = 0x10ab88;
  poVar5 = std::operator<<((ostream *)&output,"#include <boost/di.hpp>");
  uStack_620 = 0x10ab90;
  std::endl<char,std::char_traits<char>>(poVar5);
  uStack_620 = 0x10aba4;
  poVar5 = std::operator<<((ostream *)&output,"namespace di = boost::di;");
  uStack_620 = 0x10abac;
  std::endl<char,std::char_traits<char>>(poVar5);
  uStack_620 = 0x10abbc;
  std::operator<<((ostream *)&output,(string *)code);
  uStack_620 = 0x10abc9;
  std::__cxx11::stringstream::stringstream((stringstream *)&matches);
  uStack_620 = 0x10abdd;
  std::operator<<((ostream *)
                  &matches.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish,"-Werror");
  uStack_620 = 0x10abef;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&include_rgx,"<include>",0x10);
  uStack_620 = 0x10ac09;
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (&include,defines,&include_rgx,"-include",0);
  uStack_620 = 0x10ac13;
  cxx_abi_cxx11_();
  uStack_620 = 0x10ac25;
  poVar5 = std::operator<<(local_1a8,(string *)&out);
  uStack_620 = 0x10ac34;
  poVar5 = std::operator<<(poVar5," ");
  uStack_620 = 0x10ac44;
  cxxflags_abi_cxx11_(&local_5a8,true);
  uStack_620 = 0x10ac51;
  poVar5 = std::operator<<(poVar5,(string *)&local_5a8);
  uStack_620 = 0x10ac60;
  poVar5 = std::operator<<(poVar5," ");
  uStack_620 = 0x10ac6d;
  poVar5 = std::operator<<(poVar5,(string *)&include);
  uStack_620 = 0x10ac7c;
  poVar5 = std::operator<<(poVar5," ");
  uStack_620 = 0x10ac94;
  std::__cxx11::stringbuf::str();
  uStack_620 = 0x10aca4;
  poVar5 = std::operator<<(poVar5,local_588);
  uStack_620 = 0x10acb3;
  poVar5 = std::operator<<(poVar5," ");
  uStack_620 = 0x10acc3;
  poVar5 = std::operator<<(poVar5,(string *)
                                  &output.super_basic_ifstream<char,_std::char_traits<char>_>.
                                   super_basic_istream<char,_std::char_traits<char>_>.field_0xf8);
  uStack_620 = 0x10acd2;
  poVar5 = std::operator<<(poVar5," 2>");
  uStack_620 = 0x10ace1;
  poVar5 = std::operator<<(poVar5," error");
  uStack_620 = 0x10aceb;
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,id);
  uStack_620 = 0x10acfa;
  std::operator<<(poVar5,".out");
  uStack_620 = 0x10ad07;
  std::__cxx11::string::~string(local_588);
  uStack_620 = 0x10ad11;
  std::__cxx11::string::~string((string *)&local_5a8);
  uStack_620 = 0x10ad1b;
  std::__cxx11::string::~string((string *)&out);
  uStack_620 = 0x10ad25;
  std::__cxx11::string::~string((string *)&include);
  uStack_620 = 0x10ad2d;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&include_rgx);
  uStack_620 = 0x10ad3a;
  std::__cxx11::stringstream::~stringstream((stringstream *)&matches);
  uStack_620 = 0x10ad47;
  file<std::basic_ofstream<char,_std::char_traits<char>_>_>::~file
            ((file<std::basic_ofstream<char,_std::char_traits<char>_>_> *)&output);
  uStack_620 = 0x10ad5f;
  std::__cxx11::stringbuf::str();
  uStack_620 = 0x10ad73;
  poVar5 = std::operator<<((ostream *)&std::clog,(string *)&output);
  uStack_620 = 0x10ad7b;
  std::endl<char,std::char_traits<char>>(poVar5);
  uStack_620 = 0x10ad88;
  std::__cxx11::string::~string((string *)&output);
  uStack_620 = 0x10ad98;
  std::__cxx11::stringbuf::str();
  uStack_620 = 0x10ada5;
  iVar3 = system((char *)output.super_basic_ifstream<char,_std::char_traits<char>_>.
                         super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream);
  if (iVar3 == 0) {
    msg = "std::system(command.str().c_str())";
    psVar8 = (string *)&uStack_620;
    uStack_620 = 0x3f;
  }
  else {
    uStack_620 = 0x10adba;
    std::__cxx11::string::~string((string *)&output);
    uStack_620 = 0x10add0;
    std::__cxx11::string::string((string *)&include,"error",(allocator *)&local_5a8);
    uStack_620 = 0x10addc;
    std::__cxx11::to_string((string *)&out,id);
    uStack_620 = 0x10adee;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&include_rgx
                   ,&include,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
    uStack_620 = 0x10ae05;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&matches,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&include_rgx
                   ,".out");
    uStack_620 = 0x10ae1a;
    file<std::basic_ifstream<char,_std::char_traits<char>_>_>::file(&output,(string *)&matches);
    uStack_620 = 0x10ae27;
    std::__cxx11::string::~string((string *)&matches);
    uStack_620 = 0x10ae32;
    std::__cxx11::string::~string((string *)&include_rgx);
    uStack_620 = 0x10ae3c;
    std::__cxx11::string::~string((string *)&out);
    uStack_620 = 0x10ae46;
    std::__cxx11::string::~string((string *)&include);
    include_rgx._0_8_ = include_rgx._0_8_ & 0xffffffffffffff00;
    uStack_620 = 0x10ae6e;
    std::vector<bool,_std::allocator<bool>_>::vector
              (&matches,(long)(errors->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(errors->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)&include_rgx,
               (allocator_type *)&include);
    out.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    include_rgx._0_8_ = &include_rgx._M_automaton;
    include_rgx._M_loc = (locale_type)0x0;
    include_rgx._9_7_ = 0;
    out.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    out.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    include_rgx._M_automaton.
    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_1_ = 0;
    uVar4 = 0;
    while( true ) {
      uStack_620 = 0x10aeb0;
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&output,(string *)&include_rgx);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
      uStack_620 = 0x10aecb;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&out,(value_type *)&include_rgx);
      pbVar7 = (errors->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      __n = 0;
      for (pbVar9 = (errors->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar7;
          pbVar9 = pbVar9 + 1) {
        uStack_620 = 0x10aeed;
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&include,pbVar9,0x10);
        uStack_620 = 0x10aefa;
        bVar2 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &include_rgx,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&include,0);
        uStack_620 = 0x10af04;
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&include);
        if (bVar2) {
          uStack_620 = 0x10af18;
          rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&matches,__n);
          *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
        }
        __n = __n + 1;
      }
      uVar4 = uVar4 + 1;
    }
    uStack_620 = 0x10af3d;
    std::__cxx11::string::~string((string *)&include_rgx);
    if ((errors->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (errors->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish && 0x3f < uVar4) goto LAB_0010aff5;
    include_rgx._0_8_ = include_rgx._0_8_ & 0xffffffffffffff00;
    uStack_620 = 0x10af81;
    _Var11 = std::__find_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                       (matches.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                        matches.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
                        matches.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
    pbVar9 = out.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar7 = out.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((_Var11.super__Bit_iterator_base._M_p ==
         matches.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_p) &&
       (_Var11.super__Bit_iterator_base._M_offset ==
        matches.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset)) {
      uStack_620 = 0x10afa6;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&out);
      uStack_620 = 0x10afb3;
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&matches.super__Bvector_base<std::allocator<bool>_>);
      uStack_620 = 0x10afc0;
      file<std::basic_ifstream<char,_std::char_traits<char>_>_>::~file(&output);
      uStack_620 = 0x10afcd;
      std::__cxx11::stringstream::~stringstream((stringstream *)&command);
      return;
    }
    for (; pbVar7 != pbVar9; pbVar7 = pbVar7 + 1) {
      uStack_620 = 0x10b066;
      poVar5 = std::operator<<((ostream *)&std::clog,(string *)pbVar7);
      uStack_620 = 0x10b06e;
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    uStack_620 = 0x10b084;
    std::__cxx11::stringbuf::str();
    uStack_620 = 0x10b093;
    poVar5 = std::operator<<((ostream *)&std::clog,(string *)&include_rgx);
    uStack_620 = 0x10b09b;
    std::endl<char,std::char_traits<char>>(poVar5);
    uStack_620 = 0x10b0a3;
    std::__cxx11::string::~string((string *)&include_rgx);
    msg = "false";
    psVar8 = (string *)&uStack_620;
    uStack_620 = 99;
  }
  do {
    uVar1 = *(undefined8 *)psVar8;
    this = (regex *)((long)psVar8 + 8);
    *(undefined8 *)psVar8 = 0x10aff5;
    expect_fail__(msg,
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/test/ft/di_errors.cpp"
                  ,(int)uVar1);
LAB_0010aff5:
    *(undefined8 *)((long)this + -8) = 0x10b005;
    std::__cxx11::stringbuf::str();
    *(undefined8 *)((long)this + -8) = 0x10b014;
    poVar5 = std::operator<<((ostream *)&std::clog,(string *)this);
    *(undefined8 *)((long)this + -8) = 0x10b023;
    poVar5 = std::operator<<(poVar5," | lines < MAX_ERROR_LINES_COUNT");
    *(undefined8 *)((long)this + -8) = 0x10b02b;
    std::endl<char,std::char_traits<char>>(poVar5);
    *(undefined8 *)((long)this + -8) = 0x10b033;
    std::__cxx11::string::~string((string *)this);
    msg = "false";
    psVar8 = (string *)((long)this + -8);
    *(undefined8 *)((long)this + -8) = 0x5a;
  } while( true );
}

Assistant:

auto compail_fail(int id, const std::string& defines, const std::vector<std::string>& errors, const std::string& code) {
  std::stringstream command;
  {
    file<> source_code{std::string{"error"} + std::to_string(id) + ".cpp"};
    source_code << "#include <boost/di.hpp>" << std::endl;
    source_code << "namespace di = boost::di;" << std::endl;
    source_code << code;

    std::stringstream errors{};

#if defined(__CLANG__)
    errors << "-Werror";
#elif defined(__GCC__)
    errors << "-Werror";
#elif defined(__MSVC__)
    errors << "/EHsc /W3 /WX";
#endif

    const auto include_rgx = std::regex{"<include>"};

#if defined(__MSVC__)
    const auto include = std::regex_replace(defines, include_rgx, "/FI");
#else
    const auto include = std::regex_replace(defines, include_rgx, "-include");
#endif

    command << cxx() << " " << cxxflags(true) << " " << include << " " << errors.str() << " " << source_code
#if defined(__MSVC__)
            << " >"
#else
            << " 2>"
#endif
            << " error" << id << ".out";
  }

  std::clog << command.str() << std::endl;
  expect(std::system(command.str().c_str()));

  file<std::ifstream> output{std::string{"error"} + std::to_string(id) + ".out"};
  std::vector<bool> matches(errors.size(), false);
  std::vector<std::string> out;
  auto lines = 0;
  for (std::string line; std::getline(output, line);) {
    out.push_back(line);
    auto i = 0;
    for (const auto& rgx : errors) {
      if (std::regex_match(line, std::regex{rgx})) {
        matches[i] = true;
      }
      ++i;
    }
    ++lines;
  }

  if (!errors.empty()) {
#if defined(__MSVC__)
    constexpr auto MAX_ERROR_LINES_COUNT = 128;
#else
    constexpr auto MAX_ERROR_LINES_COUNT = 64;
#endif

    if (lines >= MAX_ERROR_LINES_COUNT) {
      std::clog << command.str() << " | lines < MAX_ERROR_LINES_COUNT" << std::endl;
      expect(false);
    }
  }

  if (std::find(matches.begin(), matches.end(), false) != matches.end()) {
    for (const auto& line : out) {
      std::clog << line << std::endl;
    }
    std::clog << command.str() << std::endl;
    expect(false);
  }
}
}